

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

void ZSTD_row_fillHashCache
               (ZSTD_matchState_t *ms,BYTE *base,U32 rowLog,U32 mls,U32 idx,BYTE *iLimit)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)idx;
  uVar2 = ((int)iLimit - (int)(base + uVar5)) + 1;
  uVar3 = 8;
  if (uVar2 < 8) {
    uVar3 = uVar2;
  }
  uVar2 = 0;
  if (base + uVar5 <= iLimit) {
    uVar2 = uVar3;
  }
  if (idx < uVar2 + idx) {
    cVar1 = (char)ms->rowHashLog;
    do {
      switch(mls) {
      case 5:
        uVar4 = *(long *)(base + uVar5) * -0x30e4432345000000;
        break;
      case 6:
        uVar4 = *(long *)(base + uVar5) * -0x30e4432340650000;
        break;
      case 7:
        uVar4 = *(long *)(base + uVar5) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar4 = *(long *)(base + uVar5) * -0x30e44323485a9b9d;
        break;
      default:
        uVar3 = (uint)(*(int *)(base + uVar5) * -0x61c8864f) >> (0x18U - cVar1 & 0x1f);
        goto LAB_0063c1d5;
      }
      uVar3 = (uint)(uVar4 >> (0x38U - cVar1 & 0x3f));
LAB_0063c1d5:
      ms->hashCache[(uint)uVar5 & 7] = uVar3;
      uVar5 = uVar5 + 1;
    } while (uVar2 + idx != uVar5);
  }
  return;
}

Assistant:

static void ZSTD_row_fillHashCache(ZSTD_matchState_t* ms, const BYTE* base,
                                   U32 const rowLog, U32 const mls,
                                   U32 idx, const BYTE* const iLimit)
{
    U32 const* const hashTable = ms->hashTable;
    U16 const* const tagTable = ms->tagTable;
    U32 const hashLog = ms->rowHashLog;
    U32 const maxElemsToPrefetch = (base + idx) > iLimit ? 0 : (U32)(iLimit - (base + idx) + 1);
    U32 const lim = idx + MIN(ZSTD_ROW_HASH_CACHE_SIZE, maxElemsToPrefetch);

    for (; idx < lim; ++idx) {
        U32 const hash = (U32)ZSTD_hashPtr(base + idx, hashLog + ZSTD_ROW_HASH_TAG_BITS, mls);
        U32 const row = (hash >> ZSTD_ROW_HASH_TAG_BITS) << rowLog;
        ZSTD_row_prefetch(hashTable, tagTable, row, rowLog);
        ms->hashCache[idx & ZSTD_ROW_HASH_CACHE_MASK] = hash;
    }

    DEBUGLOG(6, "ZSTD_row_fillHashCache(): [%u %u %u %u %u %u %u %u]", ms->hashCache[0], ms->hashCache[1],
                                                     ms->hashCache[2], ms->hashCache[3], ms->hashCache[4],
                                                     ms->hashCache[5], ms->hashCache[6], ms->hashCache[7]);
}